

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManFindUnatePairsInt
               (word *pOff,word *pOn,Vec_Int_t *vBinate,Vec_Ptr_t *vDivs,int nWords,
               Vec_Int_t *vUnatePairs)

{
  int iVar1;
  int b;
  int iVar2;
  int i_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  word *pIn1;
  word *pIn0;
  int c;
  int iLit1;
  int iLit0;
  word *pDiv1;
  word *pDiv0;
  int iDiv1;
  int iDiv0;
  int Limit2;
  int iDiv1_;
  int iDiv0_;
  int k;
  int i;
  int n;
  Vec_Int_t *vUnatePairs_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  Vec_Int_t *vBinate_local;
  word *pOn_local;
  word *pOff_local;
  
  iVar1 = Vec_IntSize(vBinate);
  for (iDiv0_ = 0; iDiv0_ < iVar1; iDiv0_ = iDiv0_ + 1) {
    b = Vec_IntEntry(vBinate,iDiv0_);
    for (iDiv1_ = 0; iDiv1_ < iDiv0_; iDiv1_ = iDiv1_ + 1) {
      iVar2 = Vec_IntEntry(vBinate,iDiv1_);
      i_00 = Abc_MinInt(iVar2,b);
      iVar2 = Abc_MaxInt(iVar2,b);
      pIn1 = (word *)Vec_PtrEntry(vDivs,i_00);
      pIn0 = (word *)Vec_PtrEntry(vDivs,iVar2);
      for (k = 0; k < 4; k = k + 1) {
        uVar3 = Abc_Var2Lit(i_00,k & 1);
        c = k >> 1;
        iVar4 = Abc_Var2Lit(iVar2,c);
        iVar5 = Abc_TtIntersectTwo(pOff,0,pIn0,c,pIn1,k & 1,nWords);
        if ((iVar5 == 0) && (iVar5 = Abc_TtIntersectTwo(pOn,0,pIn0,c,pIn1,k & 1,nWords), iVar5 != 0)
           ) {
          iVar4 = Abc_Var2Lit(iVar4 << 0xf | uVar3,0);
          Vec_IntPush(vUnatePairs,iVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_ManFindUnatePairsInt( word * pOff, word * pOn, Vec_Int_t * vBinate, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs )
{
    int n, i, k, iDiv0_, iDiv1_;
    int Limit2 = Vec_IntSize(vBinate);//Abc_MinInt( Vec_IntSize(vBinate), 100 );
    Vec_IntForEachEntryStop( vBinate, iDiv1_, i, Limit2 )
    Vec_IntForEachEntryStop( vBinate, iDiv0_, k, i )
    {
        int iDiv0 = Abc_MinInt( iDiv0_, iDiv1_ );
        int iDiv1 = Abc_MaxInt( iDiv0_, iDiv1_ );
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, iDiv0);
        word * pDiv1 = (word *)Vec_PtrEntry(vDivs, iDiv1);
        for ( n = 0; n < 4; n++ )
        {
            int iLit0 = Abc_Var2Lit( iDiv0, n&1 );
            int iLit1 = Abc_Var2Lit( iDiv1, n>>1 );
            //if ( !Abc_TtIntersectTwo( pOff, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) )
            if ( !Abc_TtIntersectTwo( pOff, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) && Abc_TtIntersectTwo( pOn, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) )
                Vec_IntPush( vUnatePairs, Abc_Var2Lit((iLit1 << 15) | iLit0, 0) );
        }
    }
}